

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

void __thiscall
pfederc::MatchExpr::MatchExpr
          (MatchExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr,
          vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
          *cases,unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *anyCase)

{
  Expr *pEVar1;
  pointer ptVar2;
  BodyExpr *pBVar3;
  tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  *matchp;
  pointer ptVar4;
  
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__TokenExpr_0012b6c8;
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_MATCH;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = pos->startIndex;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__MatchExpr_0012b970;
  (this->expr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (expr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (expr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->cases).
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (cases->
       super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->cases).
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (cases->
       super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->cases).
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (cases->
       super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (cases->
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (cases->
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (cases->
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->anyCase)._M_t.
  super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
       (anyCase->_M_t).
       super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
       super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
  (anyCase->_M_t).super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl = (BodyExpr *)0x0;
  pEVar1 = (this->expr)._M_t.
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar1 != (Expr *)0x0) {
    pEVar1->parent = &this->super_Expr;
    ptVar2 = (this->cases).
             super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ptVar4 = (this->cases).
                  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar2; ptVar4 = ptVar4 + 1)
    {
      *(MatchExpr **)
       ((long)(ptVar4->
              super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
              ).
              super__Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
              .
              super__Tuple_impl<2UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
              .
              super__Head_base<2UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
              ._M_head_impl._M_t.
              super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> + 8)
           = this;
    }
    pBVar3 = (this->anyCase)._M_t.
             super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
             super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
    if (pBVar3 != (BodyExpr *)0x0) {
      (pBVar3->super_Expr).parent = &this->super_Expr;
    }
    return;
  }
  __assert_fail("!!this->expr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x2d9,
                "pfederc::MatchExpr::MatchExpr(const Lexer &, const Position &, std::unique_ptr<Expr> &&, std::vector<MatchPattern> &&, std::unique_ptr<BodyExpr> &&)"
               );
}

Assistant:

MatchExpr::MatchExpr(const Lexer &lexer, const Position &pos,
    std::unique_ptr<Expr> &&expr,
    std::vector<MatchPattern> &&cases,
    std::unique_ptr<BodyExpr> &&anyCase) noexcept
    : Expr(lexer, ExprType::EXPR_MATCH, pos), expr(std::move(expr)),
      cases(std::move(cases)),
      anyCase(std::move(anyCase)) {
  assert(!!this->expr);

  this->expr->setParent(this);
  for (auto &matchp : this->cases) {
    std::get<2>(matchp)->setParent(this);
  }

  _setParent(this->anyCase, this);
}